

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O1

allocation_result __thiscall
mjs::gc_heap::allocation_context::allocate(allocation_context *this,size_t num_bytes)

{
  uint uVar1;
  uint32_t uVar2;
  allocation_result aVar3;
  
  if (num_bytes - 0xffffffff < 0xffffffff00000002) {
    __assert_fail("!\"Invalid allocation size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                  ,0xa6,
                  "gc_heap::allocation_result mjs::gc_heap::allocation_context::allocate(size_t)");
  }
  uVar1 = (uint)(num_bytes + 7 >> 3);
  if (uVar1 < this->capacity_) {
    uVar2 = uVar1 + 1;
    uVar1 = this->next_free_;
    if (uVar1 <= this->capacity_ - uVar2) {
      this->next_free_ = uVar1 + uVar2;
      this->storage_[uVar1].new_position = uVar2;
      *(undefined4 *)((long)this->storage_ + (ulong)uVar1 * 8 + 4) = 0xffffffff;
      aVar3._0_8_ = CONCAT44(0,uVar1 + 1);
      aVar3.obj = this->storage_ + aVar3._0_8_;
      return aVar3;
    }
  }
  __assert_fail("!\"Not implemented: Ran out of heap\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp",
                0xac,"gc_heap::allocation_result mjs::gc_heap::allocation_context::allocate(size_t)"
               );
}

Assistant:

gc_heap::allocation_result gc_heap::allocation_context::allocate(size_t num_bytes) {
    if (!num_bytes || num_bytes >= UINT32_MAX) {
        assert(!"Invalid allocation size");
        throw std::bad_alloc{};
    }

    const auto num_slots = 1 + bytes_to_slots(num_bytes);
    if (num_slots > capacity_ || next_free_ > capacity_ - num_slots) {
        assert(!"Not implemented: Ran out of heap");
        throw std::bad_alloc{};
    }
    const auto pos = next_free_;
    next_free_ += num_slots;
    storage_[pos].allocation.size = num_slots;
    storage_[pos].allocation.type = uninitialized_type_index;
    return { pos + 1, &storage_[pos + 1] };
}